

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O2

int raplcap_msr_pd_is_locked
              (raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,raplcap_constraint constraint
              )

{
  int iVar1;
  int iVar2;
  uint64_t in_RAX;
  raplcap_msr *ctx;
  off_t msr;
  int *piVar3;
  uint64_t msrval;
  
  msrval = in_RAX;
  ctx = get_state(rc,pkg,die);
  msr = zone_to_msr_offset(zone,ZONE_OFFSETS_PL);
  iVar2 = -1;
  if (-1 < msr && ctx != (raplcap_msr *)0x0) {
    if (constraint < (RAPLCAP_CONSTRAINT_PEAK_POWER|RAPLCAP_CONSTRAINT_SHORT_TERM)) {
      if (constraint == RAPLCAP_CONSTRAINT_PEAK_POWER) {
        iVar1 = msr_sys_read(ctx->sys,&msrval,pkg,die,0x601);
        if (iVar1 == 0) {
          iVar2 = msr_is_pl4_locked(&ctx->ctx,zone,msrval);
        }
      }
      else {
        iVar1 = msr_sys_read(ctx->sys,&msrval,pkg,die,msr);
        if (iVar1 == 0) {
          iVar2 = msr_is_zone_locked(&ctx->ctx,zone,msrval);
        }
      }
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
    }
  }
  return iVar2;
}

Assistant:

int raplcap_msr_pd_is_locked(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone,
                             raplcap_constraint constraint) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  int ret;
  raplcap_log(DEBUG, "raplcap_msr_pd_is_locked: pkg=%"PRIu32", die=%"PRIu32", zone=%d, constraint=%d\n",
              pkg, die, zone, constraint);
  if (state == NULL || msr < 0) {
    return -1;
  }
  if ((int) constraint < 0 || (int) constraint >= RAPLCAP_NCONSTRAINTS) {
    errno = EINVAL;
    return -1;
  }
  switch (constraint) {
    case RAPLCAP_CONSTRAINT_LONG_TERM:
    case RAPLCAP_CONSTRAINT_SHORT_TERM:
      if (msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
        return -1;
      }
      ret = msr_is_zone_locked(&state->ctx, zone, msrval);
      break;
    case RAPLCAP_CONSTRAINT_PEAK_POWER:
      if (msr_sys_read(state->sys, &msrval, pkg, die, MSR_VR_CURRENT_CONFIG)) {
        return -1;
      }
      ret = msr_is_pl4_locked(&state->ctx, zone, msrval);
      break;
    default:
      // unreachable
      errno = EINVAL;
      ret = -1;
      break;
  }
  return ret;
}